

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  pointer pTVar1;
  Result RVar2;
  undefined4 uVar3;
  char *pcVar4;
  Enum EVar5;
  int __c;
  ulong uVar6;
  Var *__s;
  undefined4 local_a0;
  undefined2 local_9c;
  uint64_t local_98;
  uint64_t uStack_90;
  undefined2 local_88;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar2 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar2.enum_ == Ok) {
      pcVar4 = Var::index(var,(char *)__s,__c);
      uVar6 = (ulong)pcVar4 & 0xffffffff;
      pTVar1 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar5 = pTVar1[uVar6].element.enum_;
      uVar3 = *(undefined4 *)&pTVar1[uVar6].field_0x4;
      local_88._0_1_ = pTVar1[uVar6].limits.has_max;
      local_88._1_1_ = pTVar1[uVar6].limits.is_shared;
      local_98 = pTVar1[uVar6].limits.initial;
      uStack_90 = pTVar1[uVar6].limits.max;
      local_a0 = *(undefined4 *)&pTVar1[uVar6].limits.field_0x12;
      local_9c = *(undefined2 *)&pTVar1[uVar6].limits.field_0x16;
    }
    else {
      local_9c = 0;
      local_a0 = 0;
      local_88 = 0;
      local_98 = 0;
      uStack_90 = 0;
      uVar3 = 0;
      EVar5 = Any;
    }
    (out->element).enum_ = EVar5;
    *(undefined4 *)&out->field_0x4 = uVar3;
    (out->limits).initial = local_98;
    (out->limits).max = uStack_90;
    (out->limits).has_max = (bool)(undefined1)local_88;
    (out->limits).is_shared = (bool)local_88._1_1_;
    *(undefined4 *)&(out->limits).field_0x12 = local_a0;
    *(undefined2 *)&(out->limits).field_0x16 = local_9c;
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}